

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O0

void __thiscall minihttp::HttpSocket::_DequeueMore(HttpSocket *this)

{
  bool bVar1;
  size_type sVar2;
  reference req;
  HttpSocket *this_local;
  
  _FinishRequest(this);
  sVar2 = std::
          queue<minihttp::Request,_std::deque<minihttp::Request,_std::allocator<minihttp::Request>_>_>
          ::size(&this->_requestQ);
  if (sVar2 != 0) {
    req = std::
          queue<minihttp::Request,_std::deque<minihttp::Request,_std::allocator<minihttp::Request>_>_>
          ::front(&this->_requestQ);
    bVar1 = _EnqueueOrSend(this,req,false);
    if (bVar1) {
      std::
      queue<minihttp::Request,_std::deque<minihttp::Request,_std::allocator<minihttp::Request>_>_>::
      pop(&this->_requestQ);
    }
  }
  return;
}

Assistant:

void HttpSocket::_DequeueMore(void)
{
    traceprint("HttpSocket::_DequeueMore, Q = %u\n", (unsigned)_requestQ.size());
    _FinishRequest(); // In case this was not done yet.

    // _inProgress is known to be false here
    if(_requestQ.size()) // still have other requests queued?
        if(_EnqueueOrSend(_requestQ.front(), false)) // could we send?
            _requestQ.pop(); // if so, we are done with this request

    // otherwise, we are done for now. socket is kept alive for future sends. Nothing to do.
}